

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FMaskCVar::SetGenericRepDefault(FMaskCVar *this,UCVarValue value,ECVarType type)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined8 local_38;
  UCVarValue def;
  UCVarValue UStack_28;
  ECVarType dummy;
  uint local_20;
  ECVarType local_1c;
  int val;
  ECVarType type_local;
  FMaskCVar *this_local;
  UCVarValue value_local;
  
  UStack_28 = value;
  local_1c = type;
  _val = this;
  this_local = (FMaskCVar *)value;
  iVar1 = FBaseCVar::ToInt(value,type);
  local_20 = iVar1 << ((byte)this->BitNum & 0x1f);
  uVar2 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,(long)&def + 4);
  local_38 = CONCAT44(extraout_var,local_20 | (this->BitVal ^ 0xffffffff) & uVar2);
  (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[8])(this->ValueVar,local_38,1);
  return;
}

Assistant:

void FMaskCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	int val = ToInt(value, type) << BitNum;
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	def.Int &= ~BitVal;
	def.Int |= val;
	ValueVar.SetGenericRepDefault (def, CVAR_Int);
}